

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SStream.c
# Opt level: O3

void printInt64(SStream *O,int64_t val)

{
  char *fmt;
  
  if (val < 0) {
    if ((ulong)val < 0xfffffffffffffff7) {
      val = -val;
      fmt = "-0x%lx";
    }
    else {
      val = -val;
      fmt = "-%lu";
    }
  }
  else if ((ulong)val < 10) {
    fmt = "%lu";
  }
  else {
    fmt = "0x%lx";
  }
  SStream_concat(O,fmt,val);
  return;
}

Assistant:

void printInt64(SStream *O, int64_t val)
{
	if (val >= 0) {
		if (val > HEX_THRESHOLD)
			SStream_concat(O, "0x%"PRIx64, val);
		else
			SStream_concat(O, "%"PRIu64, val);
	} else {
		if (val <- HEX_THRESHOLD) {
			if (val == LONG_MIN)
				SStream_concat(O, "-0x%"PRIx64, (uint64_t)val);
			else
				SStream_concat(O, "-0x%"PRIx64, (uint64_t)-val);
		}
		else
			SStream_concat(O, "-%"PRIu64, -val);
	}
}